

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O1

SearchResult<unsigned_long,_false> __thiscall
absl::lts_20250127::container_internal::
btree_node<absl::lts_20250127::container_internal::set_params<google::protobuf::Descriptor_const*,google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,std::allocator<google::protobuf::Descriptor_const*>,256,false>>
::
binary_search_impl<google::protobuf::Descriptor_const*,absl::lts_20250127::container_internal::key_compare_adapter<google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,google::protobuf::Descriptor_const*>::checked_compare>
          (btree_node<absl::lts_20250127::container_internal::set_params<google::protobuf::Descriptor_const*,google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,std::allocator<google::protobuf::Descriptor_const*>,256,false>>
           *this,Descriptor **k,unsigned_long s,unsigned_long e,checked_compare *comp)

{
  bool bVar1;
  unsigned_long uVar2;
  
  if (s != e) {
    if (((ulong)this & 7) != 0) {
      __assert_fail("reinterpret_cast<uintptr_t>(p) % alignment == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/layout.h"
                    ,0x1fe,
                    "CopyConst<Char, ElementType<N>> *absl::container_internal::internal_layout::LayoutImpl<std::tuple<absl::container_internal::btree_node<absl::container_internal::set_params<const google::protobuf::Descriptor *, google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare, std::allocator<const google::protobuf::Descriptor *>, 256, false>> *, unsigned int, unsigned char, const google::protobuf::Descriptor *, absl::container_internal::btree_node<absl::container_internal::set_params<const google::protobuf::Descriptor *, google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare, std::allocator<const google::protobuf::Descriptor *>, 256, false>> *>, std::integer_sequence<unsigned long, 1, 0, 4, 30, 31>, std::integer_sequence<unsigned long>, std::integer_sequence<unsigned long, 0, 1, 2, 3, 4>, std::integer_sequence<unsigned long, 0, 1, 2, 3, 4>>::Pointer(Char *) const [Elements = std::tuple<absl::container_internal::btree_node<absl::container_internal::set_params<const google::protobuf::Descriptor *, google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare, std::allocator<const google::protobuf::Descriptor *>, 256, false>> *, unsigned int, unsigned char, const google::protobuf::Descriptor *, absl::container_internal::btree_node<absl::container_internal::set_params<const google::protobuf::Descriptor *, google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare, std::allocator<const google::protobuf::Descriptor *>, 256, false>> *>, StaticSizeSeq = std::integer_sequence<unsigned long, 1, 0, 4, 30, 31>, RuntimeSizeSeq = std::integer_sequence<unsigned long>, SizeSeq = std::integer_sequence<unsigned long, 0, 1, 2, 3, 4>, OffsetSeq = std::integer_sequence<unsigned long, 0, 1, 2, 3, 4>, N = 3UL, Char = const char]"
                   );
    }
    do {
      uVar2 = s + e >> 1;
      bVar1 = key_compare_adapter<google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_const_google::protobuf::Descriptor_*>
              ::checked_compare::
              operator()<const_google::protobuf::Descriptor_*,_const_google::protobuf::Descriptor_*,_0>
                        (comp,(Descriptor **)(this + uVar2 * 8 + 0x10),k);
      if (bVar1) {
        s = uVar2 + 1;
        uVar2 = e;
      }
      e = uVar2;
    } while (s != uVar2);
  }
  return (SearchResult<unsigned_long,_false>)s;
}

Assistant:

SearchResult<size_type, false> binary_search_impl(
      const K &k, size_type s, size_type e, const Compare &comp,
      std::false_type /* IsCompareTo */) const {
    while (s != e) {
      const size_type mid = (s + e) >> 1;
      if (comp(key(mid), k)) {
        s = mid + 1;
      } else {
        e = mid;
      }
    }
    return SearchResult<size_type, false>{s};
  }